

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

Log * __thiscall FIX::ScreenLogFactory::create(ScreenLogFactory *this,SessionID *sessionID)

{
  bool bVar1;
  Dictionary *pDVar2;
  ScreenLog *this_00;
  byte local_7f;
  byte local_7e;
  byte local_7d;
  bool event;
  bool outgoing;
  bool incoming;
  undefined1 local_70 [8];
  Dictionary settings;
  SessionID *sessionID_local;
  ScreenLogFactory *this_local;
  
  settings.m_name.field_2._8_8_ = sessionID;
  Dictionary::Dictionary((Dictionary *)local_70);
  bVar1 = SessionSettings::has(&this->m_settings,(SessionID *)settings.m_name.field_2._8_8_);
  if (bVar1) {
    pDVar2 = SessionSettings::get(&this->m_settings,(SessionID *)settings.m_name.field_2._8_8_);
    Dictionary::operator=((Dictionary *)local_70,pDVar2);
  }
  init(this,(EVP_PKEY_CTX *)local_70);
  this_00 = (ScreenLog *)operator_new(0x48);
  ScreenLog::ScreenLog
            (this_00,(SessionID *)settings.m_name.field_2._8_8_,(bool)(local_7d & 1),
             (bool)(local_7e & 1),(bool)(local_7f & 1));
  Dictionary::~Dictionary((Dictionary *)local_70);
  return &this_00->super_Log;
}

Assistant:

Log* ScreenLogFactory::create( const SessionID& sessionID )
{
  Dictionary settings;
  if( m_settings.has(sessionID) ) 
    settings = m_settings.get( sessionID );

  bool incoming, outgoing, event;
  init( settings, incoming, outgoing, event );
  return new ScreenLog( sessionID, incoming, outgoing, event );
}